

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17b8f50::
BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
::RunTest(BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int),_unsigned_short,_unsigned_short>
          *this,int block_size,int run_times)

{
  int *val;
  int *val_00;
  int *val_01;
  int *val_02;
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  byte bVar4;
  ACMRandom *this_00;
  uint32_t uVar5;
  uint uVar6;
  Message *pMVar7;
  unsigned_short *puVar8;
  int iVar9;
  int iVar10;
  unsigned_short *puVar11;
  SEARCH_METHODS *pSVar12;
  AssertHelper local_a8;
  uint local_9c;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  uint local_4c;
  int local_48;
  int local_44;
  ACMRandom *local_40;
  unsigned_short *local_38;
  
  val = &this->subx_;
  val_00 = &this->suby_;
  bVar4 = ::block_size_wide[block_size];
  val_01 = &this->w_;
  local_4c = (uint)::block_size_high[block_size];
  val_02 = &this->h_;
  local_40 = &(this->
              super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
              ).rng_;
  puVar1 = this->src0_;
  puVar2 = this->src1_;
  local_38 = this->dst_ref_;
  puVar3 = this->dst_tst_;
  iVar9 = 0;
  do {
    *val = iVar9;
    if (1 < iVar9) {
      return;
    }
    iVar10 = 0;
    while( true ) {
      *val_00 = iVar10;
      iVar9 = *val;
      if (1 < iVar10) break;
      *val_01 = (uint)bVar4;
      *val_02 = local_4c;
      local_9c = 1;
      if (1 < run_times) {
        local_9c = (uint)run_times / (uint)bVar4;
      }
      local_a8.data_._0_4_ = 0;
      testing::internal::CmpHelperGT<int,int>
                ((internal *)&gtest_ar,"run_times","0",(int *)&local_9c,(int *)&local_a8);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_a8);
        pSVar12 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar12 = *(SEARCH_METHODS **)
                     gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_test.cc"
                   ,0x59,(char *)pSVar12);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_a8);
LAB_00665f0c:
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if ((long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        this_00 = local_40;
        this->subx_ = iVar9;
        this->suby_ = iVar10;
        uVar5 = testing::internal::Random::Generate(&local_40->random_,0x21);
        this->dst_offset_ = uVar5;
        uVar5 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
        this->dst_stride_ = uVar5 + this->w_;
        uVar5 = testing::internal::Random::Generate(&this_00->random_,0x21);
        this->src0_offset_ = uVar5;
        uVar5 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
        this->src0_stride_ = uVar5 + this->w_;
        uVar5 = testing::internal::Random::Generate(&this_00->random_,0x21);
        this->src1_offset_ = uVar5;
        uVar5 = testing::internal::Random::Generate(&this_00->random_,0x281 - this->w_);
        this->src1_stride_ = uVar5 + this->w_;
        uVar5 = testing::internal::Random::Generate
                          (&this_00->random_,0x281 - (this->w_ << (this->subx_ != 0)));
        this->mask_stride_ = (long)(int)((this->w_ << (this->subx_ != 0)) + uVar5);
        puVar8 = puVar2;
        puVar11 = puVar1;
        if (((int)local_9c < 2) &&
           (uVar5 = testing::internal::Random::Generate(&local_40->random_,3), uVar5 != 0)) {
          if (uVar5 == 2) {
            this->src1_stride_ = this->dst_stride_;
            this->src1_offset_ = this->dst_offset_;
            puVar8 = puVar3;
          }
          else if (uVar5 == 1) {
            this->src0_stride_ = this->dst_stride_;
            this->src0_offset_ = this->dst_offset_;
            puVar11 = puVar3;
          }
          else {
            testing::Message::Message((Message *)&gtest_ar);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_test.cc"
                       ,0x49,"Failed");
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
            }
          }
        }
        (*(this->
          super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>
          ).
          super_TestWithParam<libaom_test::FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_short_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int,_ConvolveParams_*,_int)>_>
          .super_Test._vptr_Test[6])(this,puVar11,puVar8,(ulong)local_9c);
        for (iVar9 = 0; local_44 = iVar9, iVar9 < *val_02; iVar9 = iVar9 + 1) {
          for (iVar10 = 0; local_48 = iVar10, iVar10 < *val_01; iVar10 = iVar10 + 1) {
            uVar6 = this->dst_stride_ * iVar9 + this->dst_offset_ + iVar10;
            testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                      ((internal *)&gtest_ar,"dst_ref_[dst_offset_ + r * dst_stride_ + c]",
                       "dst_tst_[dst_offset_ + r * dst_stride_ + c]",local_38 + uVar6,puVar3 + uVar6
                      );
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_a8);
              pMVar7 = testing::Message::operator<<((Message *)&local_a8,val_01);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [2])0xaa8802);
              pMVar7 = testing::Message::operator<<(pMVar7,val_02);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [7])" subx ");
              pMVar7 = testing::Message::operator<<(pMVar7,val);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [7])" suby ");
              pMVar7 = testing::Message::operator<<(pMVar7,val_00);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [5])" r: ");
              pMVar7 = testing::Message::operator<<(pMVar7,&local_44);
              pMVar7 = testing::Message::operator<<(pMVar7,(char (*) [5])" c: ");
              pMVar7 = testing::Message::operator<<(pMVar7,&local_48);
              pSVar12 = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar12 = *(SEARCH_METHODS **)
                           gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_58,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/blend_a64_mask_test.cc"
                         ,0x76,(char *)pSVar12);
              testing::internal::AssertHelper::operator=(&local_58,pMVar7);
              goto LAB_00665f0c;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
          }
        }
      }
      iVar10 = *val_00 + 1;
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

void RunTest(int block_size, int run_times) {
    for (subx_ = 0; subx_ <= 1; subx_++) {
      for (suby_ = 0; suby_ <= 1; suby_++) {
        RunOneTest(block_size, subx_, suby_, run_times);
      }
    }
  }